

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kalman_filter.cpp
# Opt level: O2

bool is_singularJacobian(VectorXd *x)

{
  double dVar1;
  CoeffReturnType pdVar2;
  
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x,0);
  dVar1 = *pdVar2;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x,1);
  return ABS((float)dVar1 * (float)dVar1 + (float)*pdVar2 * (float)*pdVar2) < 0.0001;
}

Assistant:

bool is_singularJacobian(const VectorXd &x) {
  float epsilon = 0.0001;
  float px = x(0);
  float py = x(1);
  return fabs(px*px + py*py) < epsilon;
}